

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Exception::Mark(Exception *this,Store *store)

{
  pointer pTVar1;
  uint uVar2;
  pointer pTVar3;
  ulong uVar4;
  long lVar5;
  ValueTypes params;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  RefPtr<wabt::interp::Tag> local_40;
  
  RefPtr<wabt::interp::Tag>::RefPtr(&local_40,store,(Ref)(this->tag_).index);
  Store::Mark(store,(Ref)(this->tag_).index);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&local_58,&((local_40.obj_)->type_).signature);
  pTVar3 = local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    pTVar1 = local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      uVar2 = pTVar3[uVar4].enum_ + 0x17;
      if ((uVar2 < 8) && ((0xc5U >> (uVar2 & 0x1f) & 1) != 0)) {
        Store::Mark(store,(Ref)*(size_t *)
                                ((long)&((this->args_).
                                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5
                                ));
        pTVar1 = local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pTVar3 = local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)pTVar1 - (long)pTVar3 >> 3));
  }
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)local_58.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar3);
  }
  if (local_40.obj_ != (Tag *)0x0) {
    Store::DeleteRoot(local_40.store_,local_40.root_index_);
  }
  return;
}

Assistant:

void Exception::Mark(Store& store) {
  Tag::Ptr tag(store, tag_);
  store.Mark(tag_);
  ValueTypes params = tag->type().signature;
  for (size_t i = 0; i < params.size(); i++) {
    if (params[i].IsRef()) {
      store.Mark(args_[i].Get<Ref>());
    }
  }
}